

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall sf2cute::SoundFont::ClearSamples(SoundFont *this)

{
  pointer psVar1;
  shared_ptr<sf2cute::SFSample> *sample;
  pointer psVar2;
  
  psVar1 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->samples_).
                super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    ((psVar2->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    parent_file_ = (SoundFont *)0x0;
  }
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  _M_erase_at_end(&this->samples_,
                  (this->samples_).
                  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SoundFont::ClearSamples() noexcept {
  for (const auto & sample : samples_) {
    sample->reset_parent_file();
  }
  samples_.clear();
}